

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.c
# Opt level: O0

void md5_finish(md5_state_t *pms,md5_byte_t *digest)

{
  uint local_24;
  md5_byte_t local_20 [4];
  int i;
  md5_byte_t data [8];
  md5_byte_t *digest_local;
  md5_state_t *pms_local;
  
  for (local_24 = 0; (int)local_24 < 8; local_24 = local_24 + 1) {
    local_20[(int)local_24] =
         (md5_byte_t)(pms->count[(int)local_24 >> 2] >> (sbyte)((local_24 & 3) << 3));
  }
  data = (md5_byte_t  [8])digest;
  md5_append(pms,md5_finish::pad,(ulong)((0x37 - (pms->count[0] >> 3) & 0x3f) + 1));
  md5_append(pms,local_20,8);
  for (local_24 = 0; (int)local_24 < 0x10; local_24 = local_24 + 1) {
    *(char *)((long)data + (long)(int)local_24) =
         (char)(pms->abcd[(int)local_24 >> 2] >> (sbyte)((local_24 & 3) << 3));
  }
  return;
}

Assistant:

static void md5_finish(md5_state_t *pms, md5_byte_t digest[16])
{
    static const md5_byte_t pad[64] = {
        0x80, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
        0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
        0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
        0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0
    };
    md5_byte_t data[8];
    int i;

    /* Save the length before padding. */
    for (i = 0; i < 8; ++i)
        data[i] = (md5_byte_t)(pms->count[i >> 2] >> ((i & 3) << 3));
    /* Pad to 56 bytes mod 64. */
    md5_append(pms, pad, ((55 - (pms->count[0] >> 3)) & 63) + 1);
    /* Append the length. */
    md5_append(pms, data, 8);
    for (i = 0; i < 16; ++i)
        digest[i] = (md5_byte_t)(pms->abcd[i >> 2] >> ((i & 3) << 3));
}